

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

enable_if_t<_detail::move_never<bool>::value,_bool> pybind11::move<bool>(object *obj)

{
  runtime_error *this;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  make_caster<bool> conv;
  handle local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((int)((obj->super_handle).m_ptr)->ob_refcnt < 2) {
    detail::load_type<bool,void>((type_caster<bool,_void> *)&local_c8,&obj->super_handle);
    return (enable_if_t<_detail::move_never<bool>::value,_bool>)(local_c8._0_1_ & 1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_f0.m_ptr = (PyObject *)PyObject_Str(((obj->super_handle).m_ptr)->ob_type);
  str::operator_cast_to_string(&local_a8,(str *)&local_f0);
  std::operator+(&local_68,"Unable to move from Python ",&local_a8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar2) {
    local_e8.field_2._M_allocated_capacity = *psVar2;
    local_e8.field_2._8_8_ = plVar1[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar2;
  }
  local_e8._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  type_id<bool>();
  std::operator+(&local_48,&local_e8,&local_88);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_c8 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_c8 == plVar3) {
    local_b8 = *plVar3;
    lStack_b0 = plVar1[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar3;
  }
  local_c0 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_c8);
  *(undefined ***)this = &PTR__runtime_error_00133b08;
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) str(obj.get_type()) +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}